

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocaleData::percentSign(QLocaleData *this)

{
  long lVar1;
  QLocaleData *in_RSI;
  DataRange *in_RDI;
  long in_FS_OFFSET;
  DataRange *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  percent(in_RSI);
  DataRange::getData(this_00,(char16_t *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocaleData::percentSign() const
{
    return percent().getData(single_character_data);
}